

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_json.cc
# Opt level: O0

void __thiscall QPDFJob::initializeFromJson(QPDFJob *this,string *json,bool partial)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  element_type *peVar2;
  ostream *poVar3;
  runtime_error *this_01;
  QPDFJob local_2d8;
  Handlers local_2c8;
  undefined1 local_221;
  string local_220 [32];
  reference local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *error;
  iterator __end2;
  iterator __begin2;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  ostringstream msg;
  JSON local_68 [2];
  undefined1 local_48 [8];
  JSON j;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  errors;
  bool partial_local;
  string *json_local;
  QPDFJob *this_local;
  
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&j.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  JSON::parse((JSON *)local_48,json);
  JSON::JSON(local_68,&JOB_SCHEMA);
  bVar1 = JSON::checkSchema((JSON *)local_48,local_68,1,
                            (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&j.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
  JSON::~JSON(local_68);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    config(&local_2d8);
    anon_unknown.dwarf_312103::Handlers::Handlers
              (&local_2c8,partial,(shared_ptr<QPDFJob::Config> *)&local_2d8);
    anon_unknown.dwarf_312103::Handlers::handle(&local_2c8,(JSON *)local_48);
    anon_unknown.dwarf_312103::Handlers::~Handlers(&local_2c8);
    std::shared_ptr<QPDFJob::Config>::~shared_ptr((shared_ptr<QPDFJob::Config> *)&local_2d8);
    JSON::~JSON((JSON *)local_48);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&j.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&__range2);
  peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  poVar3 = std::operator<<((ostream *)&__range2,(string *)&peVar2->message_prefix);
  std::operator<<(poVar3,": job json has errors:");
  this_00 = &j.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  __end2 = std::__cxx11::
           list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)this_00);
  error = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&error);
    if (!bVar1) break;
    local_200 = std::
                _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*(&__end2);
    poVar3 = (ostream *)std::ostream::operator<<(&__range2,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"  ");
    std::operator<<(poVar3,(string *)local_200);
    std::
    _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end2);
  }
  local_221 = 1;
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(this_01,local_220);
  local_221 = 0;
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
QPDFJob::initializeFromJson(std::string const& json, bool partial)
{
    std::list<std::string> errors;
    JSON j = JSON::parse(json);
    if (!j.checkSchema(JOB_SCHEMA, JSON::f_optional, errors)) {
        std::ostringstream msg;
        msg << m->message_prefix << ": job json has errors:";
        for (auto const& error: errors) {
            msg << std::endl << "  " << error;
        }
        throw std::runtime_error(msg.str());
    }

    Handlers(partial, config()).handle(j);
}